

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O0

char * __thiscall MidiAnalyzerSettings::SaveSettings(MidiAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive local_18 [8];
  SimpleArchive text_archive;
  MidiAnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive(local_18);
  SimpleArchive::operator<<(local_18,&this->mInputChannel);
  SimpleArchive::operator<<(local_18,this->mBitRate);
  SimpleArchive::operator<<(local_18,this->mStopBits);
  SimpleArchive::operator<<(local_18,this->mParity);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_18);
  return pcVar1;
}

Assistant:

const char* MidiAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mInputChannel;
    text_archive << mBitRate;
    text_archive << mStopBits;
    text_archive << mParity;

    return SetReturnString( text_archive.GetString() );
}